

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalNinjaGenerator::WriteBuild
          (cmGlobalNinjaGenerator *this,ostream *os,string *comment,string *rule,
          cmNinjaDeps *outputs,cmNinjaDeps *implicitOuts,cmNinjaDeps *explicitDeps,
          cmNinjaDeps *implicitDeps,cmNinjaDeps *orderOnlyDeps,cmNinjaVars *variables,
          string *rspfile,int cmdLineLimit,bool *usedResponseFile)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  long *plVar4;
  _Rb_tree_node_base *p_Var5;
  ostream *poVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  string *explicitDep;
  string *psVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  char *pcVar10;
  undefined1 auVar11 [8];
  undefined8 uVar12;
  _Rb_tree_header *p_Var13;
  char *__end;
  string arguments;
  string assignments;
  ostringstream variable_assignments;
  string local_290;
  string local_270;
  string local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_230;
  long local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  cmNinjaDeps *local_210;
  cmGlobalNinjaGenerator *local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  long local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  ostream *local_1e0;
  cmNinjaDeps *local_1d8;
  string *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [8];
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_210 = implicitOuts;
  local_208 = this;
  local_1d0 = rule;
  if (rule->_M_string_length == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "No rule for WriteBuildStatement! called with comment: ",comment);
    cmSystemTools::Error
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  }
  else {
    if ((outputs->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (outputs->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      local_1e0 = os;
      local_1d8 = outputs;
      WriteComment(os,comment);
      local_230 = &local_220;
      local_228 = 0;
      local_220._M_local_buf[0] = '\0';
      psVar8 = (explicitDeps->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      psVar1 = (explicitDeps->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (psVar8 != psVar1) {
        do {
          EncodePath(&local_290,(cmGlobalNinjaGenerator *)comment,psVar8);
          plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,0x4f8fb3);
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 == paVar9) {
            local_198[0]._0_8_ = paVar9->_M_allocated_capacity;
            local_198[0]._8_8_ = plVar4[3];
            local_1a8 = (undefined1  [8])local_198;
          }
          else {
            local_198[0]._0_8_ = paVar9->_M_allocated_capacity;
            local_1a8 = (undefined1  [8])*plVar4;
          }
          local_1a0 = plVar4[1];
          *plVar4 = (long)paVar9;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          comment = (string *)local_1a8;
          std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_1a8);
          if (local_1a8 != (undefined1  [8])local_198) {
            comment = (string *)(local_198[0]._M_allocated_capacity + 1);
            operator_delete((void *)local_1a8,(ulong)comment);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p != &local_290.field_2) {
            comment = (string *)
                      (CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                local_290.field_2._M_local_buf[0]) + 1);
            operator_delete(local_290._M_dataplus._M_p,(ulong)comment);
          }
          psVar8 = psVar8 + 1;
        } while (psVar8 != psVar1);
      }
      if ((implicitDeps->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (implicitDeps->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        pcVar10 = " |";
        std::__cxx11::string::append((char *)&local_230);
        psVar8 = (implicitDeps->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        psVar1 = (implicitDeps->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (psVar8 != psVar1) {
          do {
            EncodePath(&local_290,(cmGlobalNinjaGenerator *)pcVar10,psVar8);
            plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,0x4f8fb3)
            ;
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 == paVar9) {
              local_198[0]._0_8_ = paVar9->_M_allocated_capacity;
              local_198[0]._8_8_ = plVar4[3];
              local_1a8 = (undefined1  [8])local_198;
            }
            else {
              local_198[0]._0_8_ = paVar9->_M_allocated_capacity;
              local_1a8 = (undefined1  [8])*plVar4;
            }
            local_1a0 = plVar4[1];
            *plVar4 = (long)paVar9;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            pcVar10 = (char *)local_1a8;
            std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_1a8);
            if (local_1a8 != (undefined1  [8])local_198) {
              pcVar10 = (char *)(local_198[0]._M_allocated_capacity + 1);
              operator_delete((void *)local_1a8,(ulong)pcVar10);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) {
              pcVar10 = (char *)(CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                          local_290.field_2._M_local_buf[0]) + 1);
              operator_delete(local_290._M_dataplus._M_p,(ulong)pcVar10);
            }
            psVar8 = psVar8 + 1;
          } while (psVar8 != psVar1);
        }
      }
      if ((orderOnlyDeps->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (orderOnlyDeps->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        pcVar10 = " ||";
        std::__cxx11::string::append((char *)&local_230);
        psVar8 = (orderOnlyDeps->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        psVar1 = (orderOnlyDeps->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (psVar8 != psVar1) {
          do {
            EncodePath(&local_290,(cmGlobalNinjaGenerator *)pcVar10,psVar8);
            plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,0x4f8fb3)
            ;
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 == paVar9) {
              local_198[0]._0_8_ = paVar9->_M_allocated_capacity;
              local_198[0]._8_8_ = plVar4[3];
              local_1a8 = (undefined1  [8])local_198;
            }
            else {
              local_198[0]._0_8_ = paVar9->_M_allocated_capacity;
              local_1a8 = (undefined1  [8])*plVar4;
            }
            local_1a0 = plVar4[1];
            *plVar4 = (long)paVar9;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            pcVar10 = (char *)local_1a8;
            std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_1a8);
            if (local_1a8 != (undefined1  [8])local_198) {
              pcVar10 = (char *)(local_198[0]._M_allocated_capacity + 1);
              operator_delete((void *)local_1a8,(ulong)pcVar10);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) {
              pcVar10 = (char *)(CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                          local_290.field_2._M_local_buf[0]) + 1);
              operator_delete(local_290._M_dataplus._M_p,(ulong)pcVar10);
            }
            psVar8 = psVar8 + 1;
          } while (psVar8 != psVar1);
        }
      }
      std::__cxx11::string::append((char *)&local_230);
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      local_290._M_string_length = 0;
      local_290.field_2._M_local_buf[0] = '\0';
      auVar11 = (undefined1  [8])0x4fad0d;
      std::__cxx11::string::append((char *)&local_290);
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_1d8->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_1d8->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      if (paVar9 != paVar2) {
        this_00 = &local_208->CombinedBuildOutputs;
        do {
          EncodePath(&local_270,(cmGlobalNinjaGenerator *)auVar11,(string *)paVar9);
          plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,0x4f8fb3);
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 == paVar7) {
            local_198[0]._0_8_ = paVar7->_M_allocated_capacity;
            local_198[0]._8_8_ = plVar4[3];
            local_1a8 = (undefined1  [8])local_198;
          }
          else {
            local_198[0]._0_8_ = paVar7->_M_allocated_capacity;
            local_1a8 = (undefined1  [8])*plVar4;
          }
          local_1a0 = plVar4[1];
          *plVar4 = (long)paVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          auVar11 = local_1a8;
          std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_1a8);
          if (local_1a8 != (undefined1  [8])local_198) {
            auVar11 = (undefined1  [8])(local_198[0]._M_allocated_capacity + 1);
            operator_delete((void *)local_1a8,(ulong)auVar11);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            auVar11 = (undefined1  [8])(local_270.field_2._M_allocated_capacity + 1);
            operator_delete(local_270._M_dataplus._M_p,(ulong)auVar11);
          }
          if (local_208->ComputingUnknownDependencies == true) {
            auVar11 = (undefined1  [8])paVar9;
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)this_00,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar9);
          }
          paVar9 = paVar9 + 2;
        } while (paVar9 != paVar2);
      }
      if ((local_210->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (local_210->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        pcVar10 = " |";
        std::__cxx11::string::append((char *)&local_290);
        psVar8 = (local_210->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        psVar1 = (local_210->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (psVar8 != psVar1) {
          do {
            EncodePath(&local_270,(cmGlobalNinjaGenerator *)pcVar10,psVar8);
            plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,0x4f8fb3)
            ;
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 == paVar9) {
              local_198[0]._0_8_ = paVar9->_M_allocated_capacity;
              local_198[0]._8_8_ = plVar4[3];
              local_1a8 = (undefined1  [8])local_198;
            }
            else {
              local_198[0]._0_8_ = paVar9->_M_allocated_capacity;
              local_1a8 = (undefined1  [8])*plVar4;
            }
            local_1a0 = plVar4[1];
            *plVar4 = (long)paVar9;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            pcVar10 = (char *)local_1a8;
            std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_1a8);
            if (local_1a8 != (undefined1  [8])local_198) {
              pcVar10 = (char *)(local_198[0]._M_allocated_capacity + 1);
              operator_delete((void *)local_1a8,(ulong)pcVar10);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_dataplus._M_p != &local_270.field_2) {
              pcVar10 = (char *)(local_270.field_2._M_allocated_capacity + 1);
              operator_delete(local_270._M_dataplus._M_p,(ulong)pcVar10);
            }
            psVar8 = psVar8 + 1;
          } while (psVar8 != psVar1);
        }
      }
      std::__cxx11::string::append((char *)&local_290);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     " ",local_1d0);
      std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_1a8);
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      p_Var5 = (variables->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var13 = &(variables->_M_t)._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var5 != p_Var13) {
        do {
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"","");
          WriteVariable((ostream *)local_1a8,(string *)(p_Var5 + 1),(string *)(p_Var5 + 2),
                        &local_270,1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
          }
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        } while ((_Rb_tree_header *)p_Var5 != p_Var13);
      }
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_270,local_290._M_dataplus._M_p,
                 local_290._M_dataplus._M_p + local_290._M_string_length);
      std::__cxx11::stringbuf::str();
      if ((cmdLineLimit < 0) ||
         ((cmdLineLimit != 0 &&
          ((ulong)(uint)cmdLineLimit < local_228 + local_270._M_string_length + local_1f8 + 1000))))
      {
        paVar9 = &local_250.field_2;
        local_250._M_string_length = 0;
        local_250.field_2._M_local_buf[0] = '\0';
        local_250._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::stringbuf::str((string *)&local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != paVar9) {
          operator_delete(local_250._M_dataplus._M_p,
                          CONCAT71(local_250.field_2._M_allocated_capacity._1_7_,
                                   local_250.field_2._M_local_buf[0]) + 1);
        }
        local_250._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"RSP_FILE","");
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
        WriteVariable((ostream *)local_1a8,&local_250,rspfile,&local_1c8,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != paVar9) {
          operator_delete(local_250._M_dataplus._M_p,
                          CONCAT71(local_250.field_2._M_allocated_capacity._1_7_,
                                   local_250.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)&local_200,(ulong)local_250._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != paVar9) {
          operator_delete(local_250._M_dataplus._M_p,
                          CONCAT71(local_250.field_2._M_allocated_capacity._1_7_,
                                   local_250.field_2._M_local_buf[0]) + 1);
        }
        bVar3 = true;
      }
      else {
        bVar3 = false;
      }
      if (usedResponseFile != (bool *)0x0) {
        *usedResponseFile = bVar3;
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1e0,local_270._M_dataplus._M_p,local_270._M_string_length);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_230->_M_local_buf,local_228);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_200->_M_local_buf,local_1f8);
      if (local_200 != &local_1f0) {
        operator_delete(local_200,local_1f0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,
                        CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                 local_290.field_2._M_local_buf[0]) + 1);
      }
      if (local_230 == &local_220) {
        return;
      }
      uVar12 = CONCAT71(local_220._M_allocated_capacity._1_7_,local_220._M_local_buf[0]);
      auVar11 = (undefined1  [8])local_230;
      goto LAB_002a4339;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "No output files for WriteBuildStatement! called with comment: ",comment);
    cmSystemTools::Error
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  }
  uVar12 = local_198[0]._M_allocated_capacity;
  auVar11 = local_1a8;
  if (local_1a8 == (undefined1  [8])local_198) {
    return;
  }
LAB_002a4339:
  operator_delete((void *)auVar11,uVar12 + 1);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteBuild(
  std::ostream& os, const std::string& comment, const std::string& rule,
  const cmNinjaDeps& outputs, const cmNinjaDeps& implicitOuts,
  const cmNinjaDeps& explicitDeps, const cmNinjaDeps& implicitDeps,
  const cmNinjaDeps& orderOnlyDeps, const cmNinjaVars& variables,
  const std::string& rspfile, int cmdLineLimit, bool* usedResponseFile)
{
  // Make sure there is a rule.
  if (rule.empty()) {
    cmSystemTools::Error("No rule for WriteBuildStatement! called "
                         "with comment: " +
                         comment);
    return;
  }

  // Make sure there is at least one output file.
  if (outputs.empty()) {
    cmSystemTools::Error("No output files for WriteBuildStatement! called "
                         "with comment: " +
                         comment);
    return;
  }

  cmGlobalNinjaGenerator::WriteComment(os, comment);

  std::string arguments;

  // TODO: Better formatting for when there are multiple input/output files.

  // Write explicit dependencies.
  for (std::string const& explicitDep : explicitDeps) {
    arguments += " " + EncodePath(explicitDep);
  }

  // Write implicit dependencies.
  if (!implicitDeps.empty()) {
    arguments += " |";
    for (std::string const& implicitDep : implicitDeps) {
      arguments += " " + EncodePath(implicitDep);
    }
  }

  // Write order-only dependencies.
  if (!orderOnlyDeps.empty()) {
    arguments += " ||";
    for (std::string const& orderOnlyDep : orderOnlyDeps) {
      arguments += " " + EncodePath(orderOnlyDep);
    }
  }

  arguments += "\n";

  std::string build;

  // Write outputs files.
  build += "build";
  for (std::string const& output : outputs) {
    build += " " + EncodePath(output);
    if (this->ComputingUnknownDependencies) {
      this->CombinedBuildOutputs.insert(output);
    }
  }
  if (!implicitOuts.empty()) {
    build += " |";
    for (std::string const& implicitOut : implicitOuts) {
      build += " " + EncodePath(implicitOut);
    }
  }
  build += ":";

  // Write the rule.
  build += " " + rule;

  // Write the variables bound to this build statement.
  std::ostringstream variable_assignments;
  for (auto const& variable : variables) {
    cmGlobalNinjaGenerator::WriteVariable(variable_assignments, variable.first,
                                          variable.second, "", 1);
  }

  // check if a response file rule should be used
  std::string buildstr = build;
  std::string assignments = variable_assignments.str();
  bool useResponseFile = false;
  if (cmdLineLimit < 0 ||
      (cmdLineLimit > 0 &&
       (arguments.size() + buildstr.size() + assignments.size() + 1000) >
         static_cast<size_t>(cmdLineLimit))) {
    variable_assignments.str(std::string());
    cmGlobalNinjaGenerator::WriteVariable(variable_assignments, "RSP_FILE",
                                          rspfile, "", 1);
    assignments += variable_assignments.str();
    useResponseFile = true;
  }
  if (usedResponseFile) {
    *usedResponseFile = useResponseFile;
  }

  os << buildstr << arguments << assignments;
}